

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int dp2(DdManager *dd,DdNode *f,st__table *t)

{
  int *piVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint *key;
  DdNode *f_00;
  undefined8 uVar7;
  int E;
  int T;
  DdNode *N;
  DdNode *n;
  DdNode *g;
  st__table *t_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f == (DdNode *)0x0) {
    dd_local._4_4_ = 0;
  }
  else {
    key = (uint *)((ulong)f & 0xfffffffffffffffe);
    if (*key == 0x7fffffff) {
      uVar4 = 0x20;
      if (((ulong)f & 1) != 0) {
        uVar4 = 0x21;
      }
      fprintf((FILE *)dd->out,"ID = %c0x%lx\tvalue = %-9g\n",*(undefined8 *)(key + 4),(ulong)uVar4,
              (ulong)key / 0x28);
      dd_local._4_4_ = 1;
    }
    else {
      iVar5 = st__lookup(t,(char *)key,(char **)0x0);
      if (iVar5 == 1) {
        dd_local._4_4_ = 1;
      }
      else {
        iVar5 = st__add_direct(t,(char *)key,(char *)0x0);
        if (iVar5 == -10000) {
          dd_local._4_4_ = 0;
        }
        else {
          uVar4 = 0x20;
          if (((ulong)f & 1) != 0) {
            uVar4 = 0x21;
          }
          fprintf((FILE *)dd->out,"ID = %c0x%lx\tindex = %u\t",(ulong)uVar4,(ulong)key / 0x28,
                  (ulong)*key);
          piVar1 = *(int **)(key + 4);
          iVar5 = *piVar1;
          if (iVar5 != 0x7fffffff) {
            fprintf((FILE *)dd->out,"T = 0x%lx\t",(ulong)piVar1 / 0x28);
          }
          else {
            fprintf((FILE *)dd->out,"T = %-9g\t",*(undefined8 *)(piVar1 + 4));
          }
          uVar2 = *(ulong *)(key + 6);
          f_00 = (DdNode *)(uVar2 & 0xfffffffffffffffe);
          if (f_00->index == 0x7fffffff) {
            uVar7 = 0x20;
            if ((uVar2 & 1) != 0) {
              uVar7 = 0x21;
            }
            fprintf((FILE *)dd->out,"E = %c%-9g\n",(f_00->type).value,uVar7);
            bVar3 = true;
          }
          else {
            uVar4 = 0x20;
            if ((uVar2 & 1) != 0) {
              uVar4 = 0x21;
            }
            fprintf((FILE *)dd->out,"E = %c0x%lx\n",(ulong)uVar4,(ulong)f_00 / 0x28);
            bVar3 = false;
          }
          if ((bVar3) || (iVar6 = dp2(dd,f_00,t), iVar6 != 0)) {
            if ((iVar5 != 0x7fffffff) && (iVar5 = dp2(dd,*(DdNode **)(key + 4),t), iVar5 == 0)) {
              dd_local._4_4_ = 0;
            }
            else {
              dd_local._4_4_ = 1;
            }
          }
          else {
            dd_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return dd_local._4_4_;
}

Assistant:

static int
dp2(
  DdManager *dd,
  DdNode * f,
  st__table * t)
{
    DdNode *g, *n, *N;
    int T,E;

    if (f == NULL) {
        return(0);
    }
    g = Cudd_Regular(f);
    if (cuddIsConstant(g)) {
#if SIZEOF_VOID_P == 8
        (void) fprintf(dd->out,"ID = %c0x%lx\tvalue = %-9g\n", bang(f),
                (ptruint) g / (ptruint) sizeof(DdNode),cuddV(g));
#else
        (void) fprintf(dd->out,"ID = %c0x%x\tvalue = %-9g\n", bang(f),
                (ptruint) g / (ptruint) sizeof(DdNode),cuddV(g));
#endif
        return(1);
    }
    if ( st__is_member(t,(char *) g) == 1) {
        return(1);
    }
    if ( st__add_direct(t,(char *) g,NULL) == st__OUT_OF_MEM)
        return(0);
#ifdef DD_STATS
#if SIZEOF_VOID_P == 8
    (void) fprintf(dd->out,"ID = %c0x%lx\tindex = %d\tr = %d\t", bang(f),
                (ptruint) g / (ptruint) sizeof(DdNode), g->index, g->ref);
#else
    (void) fprintf(dd->out,"ID = %c0x%x\tindex = %d\tr = %d\t", bang(f),
                (ptruint) g / (ptruint) sizeof(DdNode),g->index,g->ref);
#endif
#else
#if SIZEOF_VOID_P == 8
    (void) fprintf(dd->out,"ID = %c0x%lx\tindex = %u\t", bang(f),
                (ptruint) g / (ptruint) sizeof(DdNode),g->index);
#else
    (void) fprintf(dd->out,"ID = %c0x%x\tindex = %hu\t", bang(f),
                (ptruint) g / (ptruint) sizeof(DdNode),g->index);
#endif
#endif
    n = cuddT(g);
    if (cuddIsConstant(n)) {
        (void) fprintf(dd->out,"T = %-9g\t",cuddV(n));
        T = 1;
    } else {
#if SIZEOF_VOID_P == 8
        (void) fprintf(dd->out,"T = 0x%lx\t",(ptruint) n / (ptruint) sizeof(DdNode));
#else
        (void) fprintf(dd->out,"T = 0x%x\t",(ptruint) n / (ptruint) sizeof(DdNode));
#endif
        T = 0;
    }

    n = cuddE(g);
    N = Cudd_Regular(n);
    if (cuddIsConstant(N)) {
        (void) fprintf(dd->out,"E = %c%-9g\n",bang(n),cuddV(N));
        E = 1;
    } else {
#if SIZEOF_VOID_P == 8
        (void) fprintf(dd->out,"E = %c0x%lx\n", bang(n), (ptruint) N/(ptruint) sizeof(DdNode));
#else
        (void) fprintf(dd->out,"E = %c0x%x\n", bang(n), (ptruint) N/(ptruint) sizeof(DdNode));
#endif
        E = 0;
    }
    if (E == 0) {
        if (dp2(dd,N,t) == 0)
            return(0);
    }
    if (T == 0) {
        if (dp2(dd,cuddT(g),t) == 0)
            return(0);
    }
    return(1);

}